

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.h
# Opt level: O3

void __thiscall args_t::~args_t(args_t *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->argc;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (this->argv[lVar2] != (char *)0x0) {
        operator_delete__(this->argv[lVar2]);
        iVar1 = this->argc;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (this->argv != (char **)0x0) {
    operator_delete__(this->argv);
    return;
  }
  return;
}

Assistant:

~args_t() {
        for (int i = 0; i < argc; i++) {
            delete[] argv[i];
        }
        delete[] argv;
    }